

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolyMeshT.hh
# Opt level: O2

void __thiscall
OpenMesh::
PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
::calc_sector_normal
          (PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
           *this,HalfedgeHandle _in_heh,Normal *_sector_normal)

{
  undefined1 local_50 [8];
  Normal vec0;
  Normal vec1;
  
  calc_sector_vectors(this,_in_heh,(Normal *)local_50,
                      (Normal *)(vec0.super_VectorDataT<double,_3>.values_ + 2));
  (_sector_normal->super_VectorDataT<double,_3>).values_[0] =
       vec0.super_VectorDataT<double,_3>.values_[0] * vec1.super_VectorDataT<double,_3>.values_[1] -
       vec1.super_VectorDataT<double,_3>.values_[0] * vec0.super_VectorDataT<double,_3>.values_[1];
  (_sector_normal->super_VectorDataT<double,_3>).values_[1] =
       vec0.super_VectorDataT<double,_3>.values_[1] * vec0.super_VectorDataT<double,_3>.values_[2] -
       vec1.super_VectorDataT<double,_3>.values_[1] * (double)local_50;
  (_sector_normal->super_VectorDataT<double,_3>).values_[2] =
       (double)local_50 * vec1.super_VectorDataT<double,_3>.values_[0] -
       vec0.super_VectorDataT<double,_3>.values_[2] * vec0.super_VectorDataT<double,_3>.values_[0];
  return;
}

Assistant:

void calc_sector_normal(HalfedgeHandle _in_heh, Normal& _sector_normal) const
  {
    Normal vec0, vec1;
    calc_sector_vectors(_in_heh, vec0, vec1);
    _sector_normal = cross(vec0, vec1);//(p2-p1)^(p0-p1)
  }